

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O3

void helper_v7m_msr_arm(CPUARMState *env,uint32_t maskreg,uint32_t val)

{
  uint32_t *puVar1;
  ulong uVar2;
  uint uVar3;
  CPUARMState *__mptr;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uintptr_t unaff_retaddr;
  
  uVar2 = env->features;
  uVar4 = (uint)uVar2;
  if ((uVar4 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) != 0x10) goto LAB_0059295a;
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
LAB_00592952:
      if (uVar3 != 0) goto LAB_0059295a;
    }
    if (0x14 < (byte)maskreg) {
      return;
    }
    bVar5 = true;
    if ((0x1000ffU >> (maskreg & 0x1f) & 1) == 0) {
      return;
    }
  }
  else {
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
      goto LAB_00592952;
    }
LAB_0059295a:
    bVar5 = false;
  }
  if ((uVar2 >> 0x25 & 1) == 0) {
switchD_005929d0_caseD_8c:
    if ((maskreg & 0xf8) == 0) {
      if ((maskreg & 4) != 0) {
        return;
      }
      uVar3 = (int)(maskreg << 0x14) >> 0x1f & 0xf8000000;
      uVar4 = uVar3 + 0xf0000;
      if ((uVar2 >> 0x22 & 1) == 0) {
        uVar4 = uVar3;
      }
      if ((maskreg >> 10 & 1) == 0) {
        uVar4 = uVar3;
      }
      if (0xfffffff < uVar4) {
        env->ZF = ~val & 0x40000000;
        env->NF = val;
        env->CF = val >> 0x1d & 1;
        env->VF = val * 8 & 0x80000000;
      }
      if ((uVar4 >> 0x1b & 1) != 0) {
        env->QF = val >> 0x1b & 1;
      }
      if ((uVar4 & 0xf0000) != 0) {
        env->GE = val >> 0x10 & 0xf;
        return;
      }
      return;
    }
    switch(maskreg & 0xff) {
    case 8:
      if (((env->v7m).exception == 0) && (((env->v7m).control[(env->v7m).secure] & 2) != 0)) {
LAB_00592c80:
        (env->v7m).other_sp = val;
        return;
      }
      break;
    case 9:
      if (((env->v7m).exception != 0) || (((env->v7m).control[(env->v7m).secure] & 2) == 0))
      goto LAB_00592c80;
      break;
    case 10:
      if ((uVar4 >> 0x1b & 1) != 0) {
        (env->v7m).msplim[(env->v7m).secure] = val & 0xfffffff8;
        return;
      }
      return;
    case 0xb:
      if ((uVar4 >> 0x1b & 1) != 0) {
        (env->v7m).psplim[(env->v7m).secure] = val & 0xfffffff8;
        return;
      }
      return;
    default:
      return;
    case 0x10:
      (env->v7m).primask[(env->v7m).secure] = val & 1;
      return;
    case 0x11:
      if ((uVar2 >> 0x26 & 1) != 0) {
        (env->v7m).basepri[(env->v7m).secure] = val & 0xff;
        return;
      }
      return;
    case 0x12:
      if ((uVar2 >> 0x26 & 1) == 0) {
        return;
      }
      uVar4 = val & 0xff;
      if (uVar4 != 0) {
        uVar3 = (env->v7m).secure;
        if (uVar4 <= (env->v7m).basepri[uVar3] - 1) {
          (env->v7m).basepri[uVar3] = uVar4;
          return;
        }
        return;
      }
      return;
    case 0x13:
      if ((uVar2 >> 0x26 & 1) != 0) {
        (env->v7m).faultmask[(env->v7m).secure] = val & 1;
        return;
      }
      return;
    case 0x14:
      if (!bVar5) {
        if (((uVar4 >> 0x1b & 1) != 0) || ((env->v7m).exception == 0)) {
          write_v7m_control_spsel_for_secstate(env,SUB41((val & 2) >> 1,0),(env->v7m).secure != 0);
          uVar2 = env->features;
        }
        if ((uVar2 >> 0x26 & 1) != 0) {
          puVar1 = (env->v7m).control + (env->v7m).secure;
          *puVar1 = *puVar1 & 0xfffffffe;
          puVar1 = (env->v7m).control + (env->v7m).secure;
          *puVar1 = *puVar1 | val & 1;
        }
      }
      if ((env[1].xregs[0xd] & 0xf) == 0) {
        return;
      }
      if ((env->v7m).secure != 0) {
        (env->v7m).control[1] = val & 8 | (env->v7m).control[1] & 0xfffffff7;
        if (bVar5) {
          return;
        }
        goto LAB_00592dd3;
      }
      if (bVar5) {
        return;
      }
      if ((uVar2 & 0x2000000000) == 0) goto LAB_00592dd3;
LAB_00592b83:
      if (((env->v7m).nsacr & 0x400) == 0) {
        return;
      }
LAB_00592dd3:
      (env->v7m).control[1] = val & 4 | (env->v7m).control[1] & 0xfffffffb;
      return;
    }
    env->regs[0xd] = val;
    return;
  }
  switch(maskreg & 0xff) {
  case 0x88:
    if ((env->v7m).secure == 0) {
      return;
    }
    goto LAB_00592c0d;
  case 0x89:
    if ((env->v7m).secure == 0) {
      return;
    }
LAB_00592c19:
    (env->v7m).other_ss_psp = val;
    break;
  case 0x8a:
    if ((env->v7m).secure != 0) {
      (env->v7m).msplim[0] = val & 0xfffffff8;
    }
    break;
  case 0x8b:
    if ((env->v7m).secure != 0) {
      (env->v7m).psplim[0] = val & 0xfffffff8;
    }
    break;
  default:
    goto switchD_005929d0_caseD_8c;
  case 0x90:
    if ((env->v7m).secure != 0) {
      (env->v7m).primask[0] = val & 1;
    }
    break;
  case 0x91:
    if (((uVar2 >> 0x26 & 1) != 0) && ((env->v7m).secure != 0)) {
      (env->v7m).basepri[0] = val & 0xff;
    }
    break;
  case 0x93:
    if (((uVar2 >> 0x26 & 1) != 0) && ((env->v7m).secure != 0)) {
      (env->v7m).faultmask[0] = val & 1;
    }
    break;
  case 0x94:
    if ((env->v7m).secure == 0) {
      return;
    }
    write_v7m_control_spsel_for_secstate(env,SUB41((val & 2) >> 1,0),false);
    if ((env->features & 0x4000000000) != 0) {
      (env->v7m).control[0] = val & 1 | (env->v7m).control[0] & 0xfffffffe;
    }
    if ((env[1].xregs[0xd] & 0xf) == 0) {
      return;
    }
    goto LAB_00592b83;
  case 0x98:
    bVar5 = ((env->v7m).control[0] & 2) != 0;
    bVar6 = (env->v7m).exception == 0;
    if ((env->v7m).secure == 0) {
      return;
    }
    if (val < (env->v7m).msplim[(ulong)(bVar6 && bVar5) * 2]) {
      cpu_restore_state_arm((CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b),unaff_retaddr,true);
      raise_exception_arm(env,0x13,0,1);
    }
    if (bVar6 && bVar5) goto LAB_00592c19;
LAB_00592c0d:
    (env->v7m).other_ss_msp = val;
  }
  return;
}

Assistant:

void HELPER(v7m_msr)(CPUARMState *env, uint32_t maskreg, uint32_t val)
{
    /*
     * We're passed bits [11..0] of the instruction; extract
     * SYSm and the mask bits.
     * Invalid combinations of SYSm and mask are UNPREDICTABLE;
     * we choose to treat them as if the mask bits were valid.
     * NB that the pseudocode 'mask' variable is bits [11..10],
     * whereas ours is [11..8].
     */
    uint32_t mask = extract32(maskreg, 8, 4);
    uint32_t reg = extract32(maskreg, 0, 8);
    int cur_el = arm_current_el(env);

    if (cur_el == 0 && reg > 7 && reg != 20) {
        /*
         * only xPSR sub-fields and CONTROL.SFPA may be written by
         * unprivileged code
         */
        return;
    }

    if (arm_feature(env, ARM_FEATURE_M_SECURITY)) {
        switch (reg) {
        case 0x88: /* MSP_NS */
            if (!env->v7m.secure) {
                return;
            }
            env->v7m.other_ss_msp = val;
            return;
        case 0x89: /* PSP_NS */
            if (!env->v7m.secure) {
                return;
            }
            env->v7m.other_ss_psp = val;
            return;
        case 0x8a: /* MSPLIM_NS */
            if (!env->v7m.secure) {
                return;
            }
            env->v7m.msplim[M_REG_NS] = val & ~7;
            return;
        case 0x8b: /* PSPLIM_NS */
            if (!env->v7m.secure) {
                return;
            }
            env->v7m.psplim[M_REG_NS] = val & ~7;
            return;
        case 0x90: /* PRIMASK_NS */
            if (!env->v7m.secure) {
                return;
            }
            env->v7m.primask[M_REG_NS] = val & 1;
            return;
        case 0x91: /* BASEPRI_NS */
            if (!env->v7m.secure || !arm_feature(env, ARM_FEATURE_M_MAIN)) {
                return;
            }
            env->v7m.basepri[M_REG_NS] = val & 0xff;
            return;
        case 0x93: /* FAULTMASK_NS */
            if (!env->v7m.secure || !arm_feature(env, ARM_FEATURE_M_MAIN)) {
                return;
            }
            env->v7m.faultmask[M_REG_NS] = val & 1;
            return;
        case 0x94: /* CONTROL_NS */
            if (!env->v7m.secure) {
                return;
            }
            write_v7m_control_spsel_for_secstate(env,
                                                 val & R_V7M_CONTROL_SPSEL_MASK,
                                                 M_REG_NS);
            if (arm_feature(env, ARM_FEATURE_M_MAIN)) {
                env->v7m.control[M_REG_NS] &= ~R_V7M_CONTROL_NPRIV_MASK;
                env->v7m.control[M_REG_NS] |= val & R_V7M_CONTROL_NPRIV_MASK;
            }
            /*
             * SFPA is RAZ/WI from NS. FPCA is RO if NSACR.CP10 == 0,
             * RES0 if the FPU is not present, and is stored in the S bank
             */
            if (cpu_isar_feature(aa32_vfp_simd, env_archcpu(env)) &&
                extract32(env->v7m.nsacr, 10, 1)) {
                env->v7m.control[M_REG_S] &= ~R_V7M_CONTROL_FPCA_MASK;
                env->v7m.control[M_REG_S] |= val & R_V7M_CONTROL_FPCA_MASK;
            }
            return;
        case 0x98: /* SP_NS */
        {
            /*
             * This gives the non-secure SP selected based on whether we're
             * currently in handler mode or not, using the NS CONTROL.SPSEL.
             */
            bool spsel = env->v7m.control[M_REG_NS] & R_V7M_CONTROL_SPSEL_MASK;
            bool is_psp = !arm_v7m_is_handler_mode(env) && spsel;
            uint32_t limit;

            if (!env->v7m.secure) {
                return;
            }

            limit = is_psp ? env->v7m.psplim[false] : env->v7m.msplim[false];

            if (val < limit) {
                CPUState *cs = env_cpu(env);

                cpu_restore_state(cs, GETPC(), true);
                raise_exception(env, EXCP_STKOF, 0, 1);
            }

            if (is_psp) {
                env->v7m.other_ss_psp = val;
            } else {
                env->v7m.other_ss_msp = val;
            }
            return;
        }
        default:
            break;
        }
    }

    if (reg >= 0 && reg <= 7) {
        v7m_msr_xpsr(env, mask, reg, val);
    } else {
        switch (reg) {
            case 8: /* MSP */
                if (v7m_using_psp(env)) {
                    env->v7m.other_sp = val;
                } else {
                    env->regs[13] = val;
                }
                break;
            case 9: /* PSP */
                if (v7m_using_psp(env)) {
                    env->regs[13] = val;
                } else {
                    env->v7m.other_sp = val;
                }
                break;
            case 10: /* MSPLIM */
                if (!arm_feature(env, ARM_FEATURE_V8)) {
                    goto bad_reg;
                }
                env->v7m.msplim[env->v7m.secure] = val & ~7;
                break;
            case 11: /* PSPLIM */
                if (!arm_feature(env, ARM_FEATURE_V8)) {
                    goto bad_reg;
                }
                env->v7m.psplim[env->v7m.secure] = val & ~7;
                break;
            case 16: /* PRIMASK */
                env->v7m.primask[env->v7m.secure] = val & 1;
                break;
            case 17: /* BASEPRI */
                if (!arm_feature(env, ARM_FEATURE_M_MAIN)) {
                    goto bad_reg;
                }
                env->v7m.basepri[env->v7m.secure] = val & 0xff;
                break;
            case 18: /* BASEPRI_MAX */
                if (!arm_feature(env, ARM_FEATURE_M_MAIN)) {
                    goto bad_reg;
                }
                val &= 0xff;
                if (val != 0 && (val < env->v7m.basepri[env->v7m.secure]
                            || env->v7m.basepri[env->v7m.secure] == 0)) {
                    env->v7m.basepri[env->v7m.secure] = val;
                }
                break;
            case 19: /* FAULTMASK */
                if (!arm_feature(env, ARM_FEATURE_M_MAIN)) {
                    goto bad_reg;
                }
                env->v7m.faultmask[env->v7m.secure] = val & 1;
                break;
            case 20: /* CONTROL */
                /*
                 * Writing to the SPSEL bit only has an effect if we are in
                 * thread mode; other bits can be updated by any privileged code.
                 * write_v7m_control_spsel() deals with updating the SPSEL bit in
                 * env->v7m.control, so we only need update the others.
                 * For v7M, we must just ignore explicit writes to SPSEL in handler
                 * mode; for v8M the write is permitted but will have no effect.
                 * All these bits are writes-ignored from non-privileged code,
                 * except for SFPA.
                 */
                if (cur_el > 0 && (arm_feature(env, ARM_FEATURE_V8) ||
                            !arm_v7m_is_handler_mode(env))) {
                    write_v7m_control_spsel(env, (val & R_V7M_CONTROL_SPSEL_MASK) != 0);
                }
                if (cur_el > 0 && arm_feature(env, ARM_FEATURE_M_MAIN)) {
                    env->v7m.control[env->v7m.secure] &= ~R_V7M_CONTROL_NPRIV_MASK;
                    env->v7m.control[env->v7m.secure] |= val & R_V7M_CONTROL_NPRIV_MASK;
                }
                if (cpu_isar_feature(aa32_vfp_simd, env_archcpu(env))) {
                    /*
                     * SFPA is RAZ/WI from NS or if no FPU.
                     * FPCA is RO if NSACR.CP10 == 0, RES0 if the FPU is not present.
                     * Both are stored in the S bank.
                     */
                    if (env->v7m.secure) {
                        env->v7m.control[M_REG_S] &= ~R_V7M_CONTROL_SFPA_MASK;
                        env->v7m.control[M_REG_S] |= val & R_V7M_CONTROL_SFPA_MASK;
                    }
                    if (cur_el > 0 &&
                            (env->v7m.secure || !arm_feature(env, ARM_FEATURE_M_SECURITY) ||
                             extract32(env->v7m.nsacr, 10, 1))) {
                        env->v7m.control[M_REG_S] &= ~R_V7M_CONTROL_FPCA_MASK;
                        env->v7m.control[M_REG_S] |= val & R_V7M_CONTROL_FPCA_MASK;
                    }
                }
                break;
            default:
bad_reg:
                qemu_log_mask(LOG_GUEST_ERROR, "Attempt to write unknown special"
                        " register %d\n", reg);
                return;
        }
    }
}